

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

double nrminf(cupdlp_int n,double *x,cupdlp_int incx)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  dVar4 = 0.0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    dVar1 = ABS(x[uVar2]);
    if (ABS(x[uVar2]) <= dVar4) {
      dVar1 = dVar4;
    }
    dVar4 = dVar1;
  }
  return dVar4;
}

Assistant:

double nrminf(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) nrm = tmp;
  }

  return nrm;
#else
  return dnrm2(n, x, incx);
#endif
}